

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QList<QString> * __thiscall
(anonymous_namespace)::splitString<QList<QString>,QString>
          (QList<QString> *__return_storage_ptr__,void *this,QString *source,QStringView sep,
          SplitBehavior behavior,CaseSensitivity cs)

{
  char16_t *pcVar1;
  long lVar2;
  qsizetype qVar3;
  storage_type_conflict *psVar4;
  ulong uVar5;
  long pos;
  char16_t *pcVar6;
  long in_FS_OFFSET;
  QStringView needle0;
  QStringView haystack0;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  psVar4 = sep.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  pos = 0;
  uVar5 = 0;
  while( true ) {
    pcVar1 = *(char16_t **)((long)this + 8);
    lVar2 = *(long *)((long)this + 0x10);
    pcVar6 = pcVar1;
    if (pcVar1 == (char16_t *)0x0) {
      pcVar6 = L"";
    }
    needle0.m_size = (qsizetype)psVar4;
    needle0.m_data = (storage_type_conflict *)source;
    haystack0.m_size = lVar2;
    haystack0.m_data = pcVar6;
    qVar3 = QtPrivate::findString
                      (haystack0,uVar5 + pos,needle0,
                       (CaseSensitivity)
                       behavior.super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
                       super_QFlagsStorage<Qt::SplitBehaviorFlags>.i);
    if (qVar3 == -1) break;
    if (qVar3 - pos != 0 || (int)sep.m_size == 0) {
      QString::QString((QString *)&local_50,(QChar *)(pcVar1 + pos),qVar3 - pos);
      QList<QString>::emplaceBack<QString>(__return_storage_ptr__,(QString *)&local_50);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    }
    pos = qVar3 + (long)psVar4;
    uVar5 = (ulong)(psVar4 == (storage_type_conflict *)0x0);
  }
  if (pos != lVar2 || (int)sep.m_size == 0) {
    QString::sliced((QString *)&local_50,(QString *)this,pos);
    QList<QString>::emplaceBack<QString>(__return_storage_ptr__,(QString *)&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static ResultList splitString(const StringSource &source, QStringView sep,
                              Qt::SplitBehavior behavior, Qt::CaseSensitivity cs)
{
    ResultList list;
    typename StringSource::size_type start = 0;
    typename StringSource::size_type end;
    typename StringSource::size_type extra = 0;
    while ((end = QtPrivate::findString(QStringView(source.constData(), source.size()), start + extra, sep, cs)) != -1) {
        if (start != end || behavior == Qt::KeepEmptyParts)
            list.append(source.sliced(start, end - start));
        start = end + sep.size();
        extra = (sep.size() == 0 ? 1 : 0);
    }
    if (start != source.size() || behavior == Qt::KeepEmptyParts)
        list.append(source.sliced(start));
    return list;
}